

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O3

ASTNode * ParseFor(Scope *scope,Lexer *lexer)

{
  uint uVar1;
  Token TVar2;
  int iVar3;
  ASTNode *pAVar4;
  char *pcVar5;
  char *pcVar6;
  ASTNode *pAVar7;
  
  iVar3 = scope->nodeSpot;
  scope->nodeSpot = iVar3 + 1;
  if (iVar3 < scope->nodeLength) {
    pAVar7 = scope->nodes + iVar3;
  }
  else {
    pAVar7 = (ASTNode *)0x0;
  }
  pAVar7->isStmt = true;
  pAVar7->type = FOR;
  TVar2 = GetNextToken(lexer);
  if (TVar2 == LPAREN) {
    TVar2 = GetNextToken(lexer);
    pAVar4 = ParseVar(scope,lexer,TVar2);
    (pAVar7->meta).binaryExpr.left = pAVar4;
    pAVar4 = ParseExpression(scope,lexer);
    (pAVar7->meta).binaryExpr.right = pAVar4;
    pAVar4 = ParseExpression(scope,lexer);
    (pAVar7->meta).forExpr.inc = pAVar4;
    TVar2 = GetNextToken(lexer);
    if (TVar2 == RPAREN) {
      iVar3 = ParseBody(scope,lexer);
      (pAVar7->meta).forExpr.body = iVar3;
      return pAVar7;
    }
    pcVar5 = TokenToString(TVar2);
    uVar1 = (lexer->tracker).row;
    iVar3 = (lexer->tracker).col + (lexer->tracker).currentTokenPosition;
    pcVar6 = "RPAREN";
  }
  else {
    pcVar5 = TokenToString(TVar2);
    uVar1 = (lexer->tracker).row;
    iVar3 = (lexer->tracker).col + (lexer->tracker).currentTokenPosition;
    pcVar6 = "LPAREN";
  }
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n",pcVar6,pcVar5,(ulong)uVar1,
         (ulong)(iVar3 - 1));
  exit(0);
}

Assistant:

ASTNode* ParseFor(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("For");
	TRACK();
	ASTNode* forExpr = GetNextNode(scope);
	SET_IS_STMT(forExpr);
	SET_NODE_TYPE(forExpr, FOR);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	tok = GetNextToken(lexer);

	/**
	 * Since this is an internal variable for a for loop,
	 * this will not be a top level statement.
	 */
	ASTNode* var = ParseVar(scope, lexer, tok);

	SET_FOR_VAR(forExpr, var);
	SET_FOR_CONDITION(forExpr, ParseExpression(scope, lexer));
	SET_FOR_INC(forExpr, ParseExpression(scope, lexer));

	tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, RPAREN, lexer);
	SET_FOR_BODY(forExpr, ParseBody(scope, lexer));
	return forExpr;
}